

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int live_con_func_n(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  bitmap_t bm;
  uint uVar1;
  int iVar2;
  uint local_40;
  int local_3c;
  int change_p;
  int n;
  edge_t_conflict e2;
  edge_t_conflict e;
  bb_insn_t_conflict bb_insn;
  MIR_op_t *op_ref;
  bb_t_conflict bb_local;
  gen_ctx_t gen_ctx_local;
  
  local_40 = 0;
  e2 = DLIST_out_edge_t_head(&bb->out_edges);
  do {
    if (e2 == (edge_t_conflict)0x0) {
      return local_40;
    }
    uVar1 = bitmap_ior(bb->out,bb->out,e2->dst->in);
    local_40 = uVar1 | local_40;
    if (gen_ctx->lr_ctx->ssa_live_info_p != 0) {
      e = (edge_t_conflict)DLIST_bb_insn_t_head(&e2->dst->bb_insns);
      while ((e != (edge_t_conflict)0x0 && ((int)e->src->bfs == 0xb4))) {
        e = (edge_t_conflict)DLIST_bb_insn_t_next((bb_insn_t_conflict)e);
      }
      if ((e != (edge_t_conflict)0x0) && ((int)e->src->bfs == 0xba)) {
        local_3c = 1;
        _change_p = DLIST_in_edge_t_head(&e2->dst->in_edges);
        while ((_change_p != (in_edge_t_conflict)0x0 && (_change_p != e2))) {
          _change_p = DLIST_in_edge_t_next(_change_p);
          local_3c = local_3c + 1;
        }
        if (_change_p != e2) {
          __assert_fail("e2 == e",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x1732,"int live_con_func_n(gen_ctx_t, bb_t)");
        }
        do {
          if (((ulong)(&e->src->bb_link)[(long)local_3c * 3].next & 0xff) == 2) {
            bm = bb->out;
            iVar2 = var_to_scan_var(gen_ctx,*(MIR_reg_t *)
                                             &(&e->src->in_edges)[(long)local_3c * 3].head);
            uVar1 = bitmap_set_bit_p(bm,(long)iVar2);
            local_40 = uVar1 | local_40;
          }
          e = (edge_t_conflict)DLIST_bb_insn_t_next((bb_insn_t_conflict)e);
        } while (((bb_insn_t_conflict)e != (bb_insn_t_conflict)0x0) &&
                ((int)*(undefined8 *)&((bb_insn_t_conflict)e)->insn->field_0x18 == 0xba));
      }
    }
    e2 = DLIST_out_edge_t_next(e2);
  } while( true );
}

Assistant:

static int live_con_func_n (gen_ctx_t gen_ctx, bb_t bb) {
  MIR_op_t *op_ref;
  bb_insn_t bb_insn;
  edge_t e, e2;
  int n, change_p = FALSE;

  for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL; e = DLIST_NEXT (out_edge_t, e)) {
    change_p |= bitmap_ior (bb->live_out, bb->live_out, e->dst->live_in);
    if (ssa_live_info_p) {
      for (bb_insn = DLIST_HEAD (bb_insn_t, e->dst->bb_insns); bb_insn != NULL;
           bb_insn = DLIST_NEXT (bb_insn_t, bb_insn))
        if (bb_insn->insn->code != MIR_LABEL) break;
      if (bb_insn == NULL || bb_insn->insn->code != MIR_PHI) continue; /* no phis in dst */
      for (n = 1, e2 = DLIST_HEAD (in_edge_t, e->dst->in_edges); e2 != NULL;
           e2 = DLIST_NEXT (in_edge_t, e2), n++)
        if (e2 == e) break;
      gen_assert (e2 == e);
      for (;;) {
        op_ref = &bb_insn->insn->ops[n];
        if (op_ref->mode == MIR_OP_VAR)
          change_p |= bitmap_set_bit_p (bb->live_out, var_to_scan_var (gen_ctx, op_ref->u.var));
        if ((bb_insn = DLIST_NEXT (bb_insn_t, bb_insn)) == NULL || bb_insn->insn->code != MIR_PHI)
          break;
      }
    }
  }
  return change_p;
}